

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O0

void __thiscall btRigidBody::setMassProps(btRigidBody *this,btScalar mass,btVector3 *inertia)

{
  btScalar *pbVar1;
  btVector3 *in_RSI;
  btVector3 *in_RDI;
  float in_XMM0_Da;
  btVector3 bVar2;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  btVector3 *this_00;
  undefined8 local_44;
  undefined8 local_3c;
  float local_34;
  float local_30;
  float local_2c;
  undefined1 local_28 [16];
  btVector3 *local_18;
  
  if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
    in_RDI[0xe].m_floats[0] = (btScalar)((uint)in_RDI[0xe].m_floats[0] & 0xfffffffe);
    in_RDI[0x19].m_floats[3] = 1.0 / in_XMM0_Da;
  }
  else {
    in_RDI[0xe].m_floats[0] = (btScalar)((uint)in_RDI[0xe].m_floats[0] | 1);
    in_RDI[0x19].m_floats[3] = 0.0;
  }
  local_18 = in_RSI;
  local_28 = (undefined1  [16])
             ::operator*((btScalar *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (btVector3 *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98))
  ;
  *(undefined8 *)in_RDI[0x1b].m_floats = local_28._0_8_;
  *(undefined8 *)(in_RDI[0x1b].m_floats + 2) = local_28._8_8_;
  this_00 = in_RDI + 0x1d;
  pbVar1 = btVector3::x(local_18);
  if ((*pbVar1 != 0.0) || (NAN(*pbVar1))) {
    pbVar1 = btVector3::x(local_18);
    local_2c = 1.0 / *pbVar1;
  }
  else {
    local_2c = 0.0;
  }
  pbVar1 = btVector3::y(local_18);
  if ((*pbVar1 != 0.0) || (NAN(*pbVar1))) {
    pbVar1 = btVector3::y(local_18);
    local_30 = 1.0 / *pbVar1;
  }
  else {
    local_30 = 0.0;
  }
  pbVar1 = btVector3::z(local_18);
  if ((*pbVar1 != 0.0) || (NAN(*pbVar1))) {
    pbVar1 = btVector3::z(local_18);
    local_34 = 1.0 / *pbVar1;
  }
  else {
    local_34 = 0.0;
  }
  btVector3::setValue(this_00,&local_2c,&local_30,&local_34);
  bVar2 = ::operator*(in_RDI,this_00->m_floats);
  local_44 = bVar2.m_floats._0_8_;
  *(undefined8 *)(in_RDI[0x28].m_floats + 2) = local_44;
  local_3c = bVar2.m_floats._8_8_;
  *(undefined8 *)in_RDI[0x29].m_floats = local_3c;
  return;
}

Assistant:

void btRigidBody::setMassProps(btScalar mass, const btVector3& inertia)
{
	if (mass == btScalar(0.))
	{
		m_collisionFlags |= btCollisionObject::CF_STATIC_OBJECT;
		m_inverseMass = btScalar(0.);
	} else
	{
		m_collisionFlags &= (~btCollisionObject::CF_STATIC_OBJECT);
		m_inverseMass = btScalar(1.0) / mass;
	}

	//Fg = m * a
	m_gravity = mass * m_gravity_acceleration;
	
	m_invInertiaLocal.setValue(inertia.x() != btScalar(0.0) ? btScalar(1.0) / inertia.x(): btScalar(0.0),
				   inertia.y() != btScalar(0.0) ? btScalar(1.0) / inertia.y(): btScalar(0.0),
				   inertia.z() != btScalar(0.0) ? btScalar(1.0) / inertia.z(): btScalar(0.0));

	m_invMass = m_linearFactor*m_inverseMass;
}